

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

char * unescape_word(Curl_easy *data,char *inputbuff)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  char *newp;
  size_t len;
  byte *local_20;
  size_t local_18;
  
  local_20 = (byte *)0x0;
  pcVar3 = (char *)0x0;
  CVar2 = Curl_urldecode(data,inputbuff,0,(char **)&local_20,&local_18,false);
  if ((local_20 != (byte *)0x0) && (CVar2 == CURLE_OK)) {
    pcVar3 = (char *)(*Curl_cmalloc)(local_18 * 2 + 1);
    if (pcVar3 != (char *)0x0) {
      iVar6 = 0;
      pbVar4 = local_20;
      while( true ) {
        bVar1 = *pbVar4;
        if (bVar1 == 0) break;
        if (((byte)(bVar1 + 0x81) < 0xa2) ||
           ((iVar5 = iVar6, bVar1 - 0x22 < 0x3b &&
            ((0x400000000000021U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)))) {
          iVar5 = iVar6 + 1;
          pcVar3[iVar6] = '\\';
        }
        iVar6 = iVar5 + 1;
        pcVar3[iVar5] = bVar1;
        pbVar4 = pbVar4 + 1;
      }
      pcVar3[iVar6] = '\0';
    }
    (*Curl_cfree)(local_20);
  }
  return pcVar3;
}

Assistant:

static char *unescape_word(struct Curl_easy *data, const char *inputbuff)
{
  char *newp = NULL;
  char *dictp;
  size_t len;

  CURLcode result = Curl_urldecode(data, inputbuff, 0, &newp, &len, FALSE);
  if(!newp || result)
    return NULL;

  dictp = malloc(len*2 + 1); /* add one for terminating zero */
  if(dictp) {
    char *ptr;
    char ch;
    int olen = 0;
    /* According to RFC2229 section 2.2, these letters need to be escaped with
       \[letter] */
    for(ptr = newp;
        (ch = *ptr) != 0;
        ptr++) {
      if((ch <= 32) || (ch == 127) ||
          (ch == '\'') || (ch == '\"') || (ch == '\\')) {
        dictp[olen++] = '\\';
      }
      dictp[olen++] = ch;
    }
    dictp[olen] = 0;
  }
  free(newp);
  return dictp;
}